

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PythonFunctions.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* GPIO::split(string *s,char d)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  istream *__x;
  char in_DL;
  string *in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  string tmp;
  stringstream buffer;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *outputVector;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  string local_1c0 [32];
  stringstream local_1a0 [399];
  char local_11;
  
  this = in_RDI;
  local_11 = in_DL;
  _Var2 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_1a0,in_RSI,_Var2);
  std::__cxx11::string::string(local_1c0);
  memset(in_RDI,0,0x18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x172a44);
  while( true ) {
    __x = std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)local_1a0,local_1c0,local_11);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(__x + *(long *)(*(long *)__x + -0x18)));
    if (!bVar1) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(this,(value_type *)__x);
  }
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return this;
}

Assistant:

vector<string> split(const string& s, const char d)
    {
        stringstream buffer(s);

        string tmp{};
        vector<string> outputVector{};

        while (getline(buffer, tmp, d))
            outputVector.push_back(tmp);

        return outputVector;
    }